

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Prog * __thiscall re2::Compiler::Finish(Compiler *this)

{
  Prog *pPVar1;
  long lVar2;
  long lVar3;
  
  if (this->failed_ == false) {
    pPVar1 = this->prog_;
    if ((pPVar1->start_ == 0) && (pPVar1->start_unanchored_ == 0)) {
      this->inst_len_ = 1;
    }
    pPVar1->inst_ = this->inst_;
    pPVar1->size_ = this->inst_len_;
    this->inst_ = (Inst *)0x0;
    Prog::Optimize(pPVar1);
    Prog::Flatten(this->prog_);
    Prog::ComputeByteMap(this->prog_);
    if (this->max_mem_ < 1) {
      lVar3 = 0x100000;
    }
    else {
      lVar2 = this->max_mem_ + (long)this->inst_len_ * -8 + -0x1b8;
      lVar3 = 0;
      if (0 < lVar2) {
        lVar3 = lVar2;
      }
    }
    pPVar1 = this->prog_;
    pPVar1->dfa_mem_ = lVar3;
    this->prog_ = (Prog *)0x0;
    return pPVar1;
  }
  return (Prog *)0x0;
}

Assistant:

Prog* Compiler::Finish() {
  if (failed_)
    return NULL;

  if (prog_->start() == 0 && prog_->start_unanchored() == 0) {
    // No possible matches; keep Fail instruction only.
    inst_len_ = 1;
  }

  // Hand off the array to Prog.
  prog_->inst_ = inst_;
  prog_->size_ = inst_len_;
  inst_ = NULL;

  prog_->Optimize();
  prog_->Flatten();
  prog_->ComputeByteMap();

  // Record remaining memory for DFA.
  if (max_mem_ <= 0) {
    prog_->set_dfa_mem(1<<20);
  } else {
    int64 m = max_mem_ - sizeof(Prog) - inst_len_*sizeof(Prog::Inst);
    if (m < 0)
      m = 0;
    prog_->set_dfa_mem(m);
  }

  Prog* p = prog_;
  prog_ = NULL;
  return p;
}